

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O2

void __thiscall Item::add(Item *this,string *prod)

{
  bool bVar1;
  __normal_iterator<Prod_*,_std::vector<Prod,_std::allocator<Prod>_>_> _Var2;
  Prod p;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [152];
  
  Prod::Prod((Prod *)local_a8,prod);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8,"S\'");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_c8,"#",&local_c9);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(local_a8 + 0x38),&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Prod*,std::vector<Prod,std::allocator<Prod>>>,__gnu_cxx::__ops::_Iter_equals_val<Prod_const>>
                    ((this->prods).super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->prods).super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_a8);
  if (_Var2._M_current ==
      (this->prods).super__Vector_base<Prod,_std::allocator<Prod>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::vector<Prod,_std::allocator<Prod>_>::push_back(&this->prods,(value_type *)local_a8);
  }
  Prod::~Prod((Prod *)local_a8);
  return;
}

Assistant:

void Item::add(string &prod) {
    Prod p = Prod(prod);
    if (p.noTerminal == "S'") {
        p.additionalVt.insert("#");
    }
    vector<Prod>::iterator it = find(prods.begin(), prods.end(), p);
    //如果vector中保存的是自定义类型（结构体/类），则需要为该类型重载==操作符。再用find
    if (it == prods.end()) {
        prods.push_back(p);
    }
}